

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Performance::DepthTests::init(DepthTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestContext *testCtx_00;
  RenderContext *renderCtx_00;
  TestNode *pTVar1;
  TestNode *pTVar2;
  FragmentTextureWorkloadCullCase *this_00;
  TestNode *pTVar3;
  PartialOccluderDiscardCullCase *pPVar4;
  PartialOccluderCullCase *pPVar5;
  GradientCostCase *pGVar6;
  OccludingGeometryComplexityCostCase *pOVar7;
  TestCaseGroup *group_7;
  TestCaseGroup *group_6;
  TestCaseGroup *group_5;
  TestCaseGroup *testCostGroup;
  TestCaseGroup *group_4;
  TestCaseGroup *group_3;
  TestCaseGroup *group_2;
  TestCaseGroup *group_1;
  TestCaseGroup *group;
  TestCaseGroup *cullEfficiencyGroup;
  RenderContext *renderCtx;
  TestContext *testCtx;
  DepthTests *this_local;
  
  testCtx_00 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  renderCtx_00 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "cull_efficiency","Fragment cull efficiency");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"workload",
             "Workload");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  this_00 = (FragmentTextureWorkloadCullCase *)operator_new(0xd8);
  Performance::anon_unknown_0::FragmentTextureWorkloadCullCase::FragmentTextureWorkloadCullCase
            (this_00,testCtx_00,renderCtx_00,"workload_texture",
             "Fragment shader with texture lookup workload");
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
  pTVar3 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::FragmentArithmeticWorkloadCullCase::
  FragmentArithmeticWorkloadCullCase
            ((FragmentArithmeticWorkloadCullCase *)pTVar3,testCtx_00,renderCtx_00,
             "workload_arithmetic","Fragment shader with arithmetic workload");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::FragmentDiscardArithmeticWorkloadCullCase::
  FragmentDiscardArithmeticWorkloadCullCase
            ((FragmentDiscardArithmeticWorkloadCullCase *)pTVar3,testCtx_00,renderCtx_00,
             "workload_arithmetic_discard",
             "Fragment shader that may discard with arithmetic workload");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "occluder_discard","Discard");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pPVar4 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar4,testCtx_00,renderCtx_00,"grid_256","Parts of occluder geometry discarded",0x100)
  ;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar4);
  pPVar4 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar4,testCtx_00,renderCtx_00,"grid_128","Parts of occluder geometry discarded",0x80);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar4);
  pPVar4 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar4,testCtx_00,renderCtx_00,"grid_64","Parts of occluder geometry discarded",0x40);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar4);
  pPVar4 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar4,testCtx_00,renderCtx_00,"grid_32","Parts of occluder geometry discarded",0x20);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar4);
  pPVar4 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar4,testCtx_00,renderCtx_00,"grid_16","Parts of occluder geometry discarded",0x10);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar4);
  pPVar4 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar4,testCtx_00,renderCtx_00,"grid_8","Parts of occluder geometry discarded",8);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar4);
  pPVar4 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar4,testCtx_00,renderCtx_00,"grid_4","Parts of occluder geometry discarded",4);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar4);
  pPVar4 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar4,testCtx_00,renderCtx_00,"grid_2","Parts of occluder geometry discarded",2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar4);
  pPVar4 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar4,testCtx_00,renderCtx_00,"grid_1","Parts of occluder geometry discarded",1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar4);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "partial_coverage","Partial Coverage");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pPVar5 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar5,testCtx_00,renderCtx_00,"100","Occluder covering only part of occluded geometry"
             ,1.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar5,testCtx_00,renderCtx_00,"099","Occluder covering only part of occluded geometry"
             ,0.99);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar5,testCtx_00,renderCtx_00,"095","Occluder covering only part of occluded geometry"
             ,0.95);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar5,testCtx_00,renderCtx_00,"090","Occluder covering only part of occluded geometry"
             ,0.9);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar5,testCtx_00,renderCtx_00,"080","Occluder covering only part of occluded geometry"
             ,0.8);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar5,testCtx_00,renderCtx_00,"070","Occluder covering only part of occluded geometry"
             ,0.7);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar5,testCtx_00,renderCtx_00,"050","Occluder covering only part of occluded geometry"
             ,0.5);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar5,testCtx_00,renderCtx_00,"025","Occluder covering only part of occluded geometry"
             ,0.25);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar5,testCtx_00,renderCtx_00,"010","Occluder covering only part of occluded geometry"
             ,0.1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar5);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"frag_depth",
             "Partial Coverage");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar3 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::StaticOccluderFragDepthCullCase::StaticOccluderFragDepthCullCase
            ((StaticOccluderFragDepthCullCase *)pTVar3,testCtx_00,renderCtx_00,"occluder_static","")
  ;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::DynamicOccluderFragDepthCullCase::DynamicOccluderFragDepthCullCase
            ((DynamicOccluderFragDepthCullCase *)pTVar3,testCtx_00,renderCtx_00,"occluder_dynamic",
             "");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::StaticOccludedFragDepthCullCase::StaticOccludedFragDepthCullCase
            ((StaticOccludedFragDepthCullCase *)pTVar3,testCtx_00,renderCtx_00,"occluded_static","")
  ;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar3 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::DynamicOccludedFragDepthCullCase::DynamicOccludedFragDepthCullCase
            ((DynamicOccludedFragDepthCullCase *)pTVar3,testCtx_00,renderCtx_00,"occluded_dynamic",
             "");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"order",
             "Rendering order");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar1 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::ReversedDepthOrderCullCase::ReversedDepthOrderCullCase
            ((ReversedDepthOrderCullCase *)pTVar1,testCtx_00,renderCtx_00,"reversed",
             "Back to front rendering order");
  tcu::TestNode::addChild(pTVar2,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "culled_pixel_cost","Fragment cull efficiency");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"gradient",
             "Gradients with small depth differences");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar3 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::BaseCostCase::BaseCostCase
            ((BaseCostCase *)pTVar3,testCtx_00,renderCtx_00,"flat","");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pGVar6 = (GradientCostCase *)operator_new(0xd0);
  Performance::anon_unknown_0::GradientCostCase::GradientCostCase
            (pGVar6,testCtx_00,renderCtx_00,"gradient_050","",0.5);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar6);
  pGVar6 = (GradientCostCase *)operator_new(0xd0);
  Performance::anon_unknown_0::GradientCostCase::GradientCostCase
            (pGVar6,testCtx_00,renderCtx_00,"gradient_010","",0.1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar6);
  pGVar6 = (GradientCostCase *)operator_new(0xd0);
  Performance::anon_unknown_0::GradientCostCase::GradientCostCase
            (pGVar6,testCtx_00,renderCtx_00,"gradient_005","",0.05);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar6);
  pGVar6 = (GradientCostCase *)operator_new(0xd0);
  Performance::anon_unknown_0::GradientCostCase::GradientCostCase
            (pGVar6,testCtx_00,renderCtx_00,"gradient_002","",0.02);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar6);
  pGVar6 = (GradientCostCase *)operator_new(0xd0);
  Performance::anon_unknown_0::GradientCostCase::GradientCostCase
            (pGVar6,testCtx_00,renderCtx_00,"gradient_001","",0.01);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar6);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "occluder_geometry","Occluders with varying geometry complexity");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"flat_uniform_grid_5","",5,0.0,0.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"flat_uniform_grid_15","",0xf,0.0,0.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"flat_uniform_grid_25","",0x19,0.0,0.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"flat_uniform_grid_50","",0x32,0.0,0.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"flat_uniform_grid_100","",100,0.0,0.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"flat_noisy_grid_5","",5,0.2,0.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"flat_noisy_grid_15","",0xf,0.06666667,0.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"flat_noisy_grid_25","",0x19,0.04,0.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"flat_noisy_grid_50","",0x32,0.02,0.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"flat_noisy_grid_100","",100,0.01,0.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"uneven_uniform_grid_5","",5,0.0,0.2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"uneven_uniform_grid_15","",0xf,0.0,0.2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"uneven_uniform_grid_25","",0x19,0.0,0.2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"uneven_uniform_grid_50","",0x32,0.0,0.2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"uneven_uniform_grid_100","",100,0.0,0.2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"uneven_noisy_grid_5","",5,0.2,0.2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"uneven_noisy_grid_15","",0xf,0.06666667,0.2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"uneven_noisy_grid_25","",0x19,0.04,0.2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"uneven_noisy_grid_50","",0x32,0.02,0.2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pOVar7 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar7,testCtx_00,renderCtx_00,"uneven_noisy_grid_100","",100,0.01,0.2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pOVar7);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"frag_depth",
             "Modifying gl_FragDepth");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar1 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::OccluderStaticFragDepthCostCase::OccluderStaticFragDepthCostCase
            ((OccluderStaticFragDepthCostCase *)pTVar1,testCtx_00,renderCtx_00,"occluder_static","")
  ;
  tcu::TestNode::addChild(pTVar2,pTVar1);
  pTVar1 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::OccluderDynamicFragDepthCostCase::OccluderDynamicFragDepthCostCase
            ((OccluderDynamicFragDepthCostCase *)pTVar1,testCtx_00,renderCtx_00,"occluder_dynamic",
             "");
  tcu::TestNode::addChild(pTVar2,pTVar1);
  pTVar1 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::OccludedStaticFragDepthCostCase::OccludedStaticFragDepthCostCase
            ((OccludedStaticFragDepthCostCase *)pTVar1,testCtx_00,renderCtx_00,"occluded_static","")
  ;
  tcu::TestNode::addChild(pTVar2,pTVar1);
  pTVar1 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::OccludedDynamicFragDepthCostCase::OccludedDynamicFragDepthCostCase
            ((OccludedDynamicFragDepthCostCase *)pTVar1,testCtx_00,renderCtx_00,"occluded_dynamic",
             "");
  tcu::TestNode::addChild(pTVar2,pTVar1);
  return extraout_EAX;
}

Assistant:

void DepthTests::init (void)
{
	TestContext&			testCtx		= m_context.getTestContext();
	const RenderContext&	renderCtx	= m_context.getRenderContext();

	{
		tcu::TestCaseGroup* const cullEfficiencyGroup = new tcu::TestCaseGroup(m_testCtx, "cull_efficiency", "Fragment cull efficiency");

		addChild(cullEfficiencyGroup);

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "workload", "Workload");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new FragmentTextureWorkloadCullCase(			testCtx, renderCtx, "workload_texture",				"Fragment shader with texture lookup workload"));
			group->addChild(new FragmentArithmeticWorkloadCullCase(			testCtx, renderCtx, "workload_arithmetic",			"Fragment shader with arithmetic workload"));
			group->addChild(new FragmentDiscardArithmeticWorkloadCullCase(	testCtx, renderCtx, "workload_arithmetic_discard",	"Fragment shader that may discard with arithmetic workload"));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "occluder_discard", "Discard");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_256",	"Parts of occluder geometry discarded", 256));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_128",	"Parts of occluder geometry discarded", 128));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_64",	"Parts of occluder geometry discarded", 64));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_32",	"Parts of occluder geometry discarded", 32));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_16",	"Parts of occluder geometry discarded", 16));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_8",	"Parts of occluder geometry discarded", 8));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_4",	"Parts of occluder geometry discarded", 4));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_2",	"Parts of occluder geometry discarded", 2));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_1",	"Parts of occluder geometry discarded", 1));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "partial_coverage", "Partial Coverage");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "100", "Occluder covering only part of occluded geometry", 1.00f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "099", "Occluder covering only part of occluded geometry", 0.99f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "095", "Occluder covering only part of occluded geometry", 0.95f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "090", "Occluder covering only part of occluded geometry", 0.90f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "080", "Occluder covering only part of occluded geometry", 0.80f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "070", "Occluder covering only part of occluded geometry", 0.70f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "050", "Occluder covering only part of occluded geometry", 0.50f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "025", "Occluder covering only part of occluded geometry", 0.25f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "010", "Occluder covering only part of occluded geometry", 0.10f));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "frag_depth", "Partial Coverage");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new StaticOccluderFragDepthCullCase( testCtx, renderCtx, "occluder_static", ""));
			group->addChild(new DynamicOccluderFragDepthCullCase(testCtx, renderCtx, "occluder_dynamic", ""));
			group->addChild(new StaticOccludedFragDepthCullCase( testCtx, renderCtx, "occluded_static", ""));
			group->addChild(new DynamicOccludedFragDepthCullCase(testCtx, renderCtx, "occluded_dynamic", ""));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "order", "Rendering order");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new ReversedDepthOrderCullCase(testCtx, renderCtx, "reversed", "Back to front rendering order"));
		}
	}

	{
		tcu::TestCaseGroup* const testCostGroup = new tcu::TestCaseGroup(m_testCtx, "culled_pixel_cost", "Fragment cull efficiency");

		addChild(testCostGroup);

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "gradient", "Gradients with small depth differences");

			testCostGroup->addChild(group);

			group->addChild(new BaseCostCase(testCtx, renderCtx, "flat", ""));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_050", "", 0.50f));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_010", "", 0.10f));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_005", "", 0.05f));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_002", "", 0.02f));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_001", "", 0.01f));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "occluder_geometry", "Occluders with varying geometry complexity");

			testCostGroup->addChild(group);

			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_5",   "", 5,   0.0f, 0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_15",  "", 15,  0.0f, 0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_25",  "", 25,  0.0f, 0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_50",  "", 50,  0.0f, 0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_100", "", 100, 0.0f, 0.0f));

			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_5",   "", 5,   1.0f/5.0f,   0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_15",  "", 15,  1.0f/15.0f,  0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_25",  "", 25,  1.0f/25.0f,  0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_50",  "", 50,  1.0f/50.0f,  0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_100", "", 100, 1.0f/100.0f, 0.0f));

			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_5",   "", 5,   0.0f, 0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_15",  "", 15,  0.0f, 0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_25",  "", 25,  0.0f, 0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_50",  "", 50,  0.0f, 0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_100", "", 100, 0.0f, 0.2f));

			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_5",   "", 5,   1.0f/5.0f,   0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_15",  "", 15,  1.0f/15.0f,  0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_25",  "", 25,  1.0f/25.0f,  0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_50",  "", 50,  1.0f/50.0f,  0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_100", "", 100, 1.0f/100.0f, 0.2f));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "frag_depth", "Modifying gl_FragDepth");

			testCostGroup->addChild(group);

			group->addChild(new OccluderStaticFragDepthCostCase( testCtx, renderCtx, "occluder_static", ""));
			group->addChild(new OccluderDynamicFragDepthCostCase(testCtx, renderCtx, "occluder_dynamic", ""));
			group->addChild(new OccludedStaticFragDepthCostCase( testCtx, renderCtx, "occluded_static", ""));
			group->addChild(new OccludedDynamicFragDepthCostCase(testCtx, renderCtx, "occluded_dynamic", ""));
		}
	}
}